

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O0

void __thiscall libtorrent::state_changed_alert::~state_changed_alert(state_changed_alert *this)

{
  state_changed_alert *this_local;
  
  torrent_alert::~torrent_alert(&this->super_torrent_alert);
  return;
}

Assistant:

struct TORRENT_EXPORT state_changed_alert final : torrent_alert
	{
		// internal
		TORRENT_UNEXPORT state_changed_alert(aux::stack_allocator& alloc, torrent_handle const& h
			, torrent_status::state_t st
			, torrent_status::state_t prev_st);

		TORRENT_DEFINE_ALERT_PRIO(state_changed_alert, 10, alert_priority::high)

		static inline constexpr alert_category_t static_category = alert_category::status;

		std::string message() const override;

		// the new state of the torrent.
		torrent_status::state_t const state;

		// the previous state.
		torrent_status::state_t const prev_state;
	}